

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

string * __thiscall
svg::Fill::toString_abi_cxx11_(string *__return_storage_ptr__,Fill *this,Layout *layout)

{
  string *in_R8;
  stringstream local_230 [8];
  stringstream ss;
  ostream local_220 [376];
  string local_a8;
  string local_88 [32];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::stringstream::stringstream(local_230);
  std::__cxx11::string::string(local_88,"fill",&local_22);
  Color::toString_abi_cxx11_(&local_68,&this->color,layout);
  std::__cxx11::string::string((string *)&local_48,"",&local_21);
  attribute<std::__cxx11::string>(&local_a8,(svg *)local_88,&local_68,&local_48,in_R8);
  std::operator<<(local_220,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("fill", color.toString(layout));
            return ss.str();
        }